

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

bool __thiscall basisu::basis_compressor::validate_ktx2_constraints(basis_compressor *this)

{
  uint32_t uVar1;
  uint uVar2;
  basisu_backend_slice_desc *pbVar3;
  uint *puVar4;
  long in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  vector<unsigned_int> total_mips;
  uint32_t i;
  uint32_t total_layers;
  uint32_t base_height;
  uint32_t base_width;
  size_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint local_48;
  uint local_34;
  uint local_20;
  uint local_1c;
  uint32_t local_18;
  uint32_t local_14;
  bool local_1;
  
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  for (local_20 = 0;
      uVar1 = vector<basisu::basisu_backend_slice_desc>::size
                        ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
      local_20 < uVar1; local_20 = local_20 + 1) {
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[]
                       ((vector<basisu::basisu_backend_slice_desc> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    if (pbVar3->m_mip_index == 0) {
      if (local_14 == 0) {
        pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
        local_14 = pbVar3->m_orig_width;
        pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
        local_18 = pbVar3->m_orig_height;
      }
      else {
        pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48);
        if ((pbVar3->m_orig_width != local_14) ||
           (pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[]
                               ((vector<basisu::basisu_backend_slice_desc> *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                in_stack_ffffffffffffff48), pbVar3->m_orig_height != local_18)) {
          return false;
        }
      }
      pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[]
                         ((vector<basisu::basisu_backend_slice_desc> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
      local_1c = maximum<unsigned_int>(local_1c,pbVar3->m_source_file_index + 1);
    }
  }
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  for (local_34 = 0;
      uVar1 = vector<basisu::basisu_backend_slice_desc>::size
                        ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
      local_34 < uVar1; local_34 = local_34 + 1) {
    vector<basisu::basisu_backend_slice_desc>::operator[]
              ((vector<basisu::basisu_backend_slice_desc> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    uVar2 = *puVar4;
    pbVar3 = vector<basisu::basisu_backend_slice_desc>::operator[]
                       ((vector<basisu::basisu_backend_slice_desc> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    uVar2 = maximum<unsigned_int>(uVar2,pbVar3->m_mip_index + 1);
    vector<basisu::basisu_backend_slice_desc>::operator[]
              ((vector<basisu::basisu_backend_slice_desc> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    *puVar4 = uVar2;
  }
  local_48 = 1;
  do {
    if (local_1c <= local_48) {
      local_1 = true;
LAB_004bb19f:
      vector<unsigned_int>::~vector
                ((vector<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      return local_1;
    }
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff54 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    if (in_stack_ffffffffffffff54 != *puVar4) {
      local_1 = false;
      goto LAB_004bb19f;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool basis_compressor::validate_ktx2_constraints()
	{
		uint32_t base_width = 0, base_height = 0;
		uint32_t total_layers = 0;
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			if (m_slice_descs[i].m_mip_index == 0)
			{
				if (!base_width)
				{
					base_width = m_slice_descs[i].m_orig_width;
					base_height = m_slice_descs[i].m_orig_height;
				}
				else
				{
					if ((m_slice_descs[i].m_orig_width != base_width) || (m_slice_descs[i].m_orig_height != base_height))
					{
						return false;
					}
				}

				total_layers = maximum<uint32_t>(total_layers, m_slice_descs[i].m_source_file_index + 1);
			}
		}

		basisu::vector<uint32_t> total_mips(total_layers);
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
			total_mips[m_slice_descs[i].m_source_file_index] = maximum<uint32_t>(total_mips[m_slice_descs[i].m_source_file_index], m_slice_descs[i].m_mip_index + 1);

		for (uint32_t i = 1; i < total_layers; i++)
		{
			if (total_mips[0] != total_mips[i])
			{
				return false;
			}
		}

		return true;
	}